

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O0

void __thiscall
pstd::array<const_float_*,_2>::array
          (array<const_float_*,_2> *this,initializer_list<const_float_*> v)

{
  const_iterator ppfVar1;
  undefined8 *in_RDI;
  float **val;
  const_iterator __end0;
  const_iterator __begin0;
  initializer_list<const_float_*> *__range2;
  size_t i;
  initializer_list<const_float_*> *this_00;
  undefined8 *local_48;
  const_iterator local_30;
  long local_20;
  initializer_list<const_float_*> local_10;
  
  this_00 = (initializer_list<const_float_*> *)(in_RDI + 2);
  local_48 = in_RDI;
  do {
    *local_48 = 0;
    local_48 = local_48 + 1;
  } while ((initializer_list<const_float_*> *)local_48 != this_00);
  local_20 = 0;
  local_30 = std::initializer_list<const_float_*>::begin(&local_10);
  ppfVar1 = std::initializer_list<const_float_*>::end(this_00);
  for (; local_30 != ppfVar1; local_30 = local_30 + 1) {
    in_RDI[local_20] = *local_30;
    local_20 = local_20 + 1;
  }
  return;
}

Assistant:

PBRT_CPU_GPU
    array(std::initializer_list<T> v) {
        size_t i = 0;
        for (const T &val : v)
            values[i++] = val;
    }